

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1cc54d::CliqueRunner::colour_class_order
          (CliqueRunner *this,SVOBitset *p,int *p_order,int *p_bounds,int *p_end)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  SVOBitset *in_RDI;
  int *in_R8;
  int v;
  SVOBitset q;
  uint colour;
  SVOBitset p_left;
  undefined6 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  SVOBitset *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  SVOBitset *in_stack_fffffffffffffec0;
  int local_b4;
  
  gss::innards::SVOBitset::SVOBitset
            (in_RDI,(SVOBitset *)
                    CONCAT17(in_stack_fffffffffffffe9f,
                             CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)));
  local_b4 = 0;
  *in_R8 = 0;
  while( true ) {
    bVar1 = gss::innards::SVOBitset::any
                      ((SVOBitset *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (!bVar1) break;
    local_b4 = local_b4 + 1;
    gss::innards::SVOBitset::SVOBitset
              (in_RDI,(SVOBitset *)
                      CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)))
    ;
    while( true ) {
      in_stack_fffffffffffffe9e =
           gss::innards::SVOBitset::any
                     ((SVOBitset *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      if (!(bool)in_stack_fffffffffffffe9e) break;
      in_stack_fffffffffffffeac =
           gss::innards::SVOBitset::find_first
                     ((SVOBitset *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      gss::innards::SVOBitset::reset(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      gss::innards::SVOBitset::reset(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                 ((long)&in_RDI->_data + 0x40),(long)(int)in_stack_fffffffffffffeac);
      gss::innards::SVOBitset::intersect_with_complement
                (in_stack_fffffffffffffeb0,
                 (SVOBitset *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      *(int *)(in_RCX + (long)*in_R8 * 4) = local_b4;
      *(uint *)(in_RDX + (long)*in_R8 * 4) = in_stack_fffffffffffffeac;
      *in_R8 = *in_R8 + 1;
    }
    gss::innards::SVOBitset::~SVOBitset(in_RDI);
  }
  gss::innards::SVOBitset::~SVOBitset(in_RDI);
  return;
}

Assistant:

auto colour_class_order(
            const SVOBitset & p,
            int * p_order,
            int * p_bounds,
            int & p_end) -> void
        {
            SVOBitset p_left = p; // not coloured yet
            unsigned colour = 0;  // current colour
            p_end = 0;

            // while we've things left to colour
            while (p_left.any()) {
                // next colour
                ++colour;
                // things that can still be given this colour
                SVOBitset q = p_left;

                // while we can still give something this colour
                while (q.any()) {
                    // first thing we can colour
                    int v = q.find_first();
                    p_left.reset(v);
                    q.reset(v);

                    // can't give anything adjacent to this the same colour
                    q.intersect_with_complement(adj[v]);

                    // record in result
                    p_bounds[p_end] = colour;
                    p_order[p_end] = v;
                    ++p_end;
                }
            }
        }